

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::Unsubtyping,(wasm::
Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
(anonymous_namespace)::Unsubtyping&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm::
(anonymous_namespace)::Unsubtyping,std::less<wasm::Function*>,std::allocator<std::pair<wasm::
Function*const,wasm::(anonymous_namespace)::Unsubtyping>>>&,std::function<void(wasm::Function*,wasm
::(anonymous)::Unsubtyping__>_(void *this,Module *module,Map *map,Func *work)

{
  Func *work_local;
  Map *map_local;
  Module *module_local;
  Mapper *this_local;
  
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::WalkerPass
            ((WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *)this);
  *(undefined ***)this = &PTR__Mapper_030a1b58;
  *(Module **)((long)this + 0x130) = module;
  *(Map **)((long)this + 0x138) = map;
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)>::function
            ((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> *)
             ((long)this + 0x140),
             (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::Unsubtyping_&)> *)work);
  return;
}

Assistant:

Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}